

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

Values * __thiscall
Executor::loadInitial(Values *__return_storage_ptr__,Executor *this,uint numberOfUnits)

{
  uint *puVar1;
  uint *puVar2;
  ostream *poVar3;
  runtime_error *this_00;
  long lVar4;
  allocator_type local_31;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)numberOfUnits,&local_31);
  lVar4 = 0;
  do {
    if ((ulong)numberOfUnits << 2 == lVar4) {
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Insert initial state of ",0x18);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,". unit:\n> ",10);
    std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
    puVar1 = (uint *)((long)(__return_storage_ptr__->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + lVar4);
    puVar2 = (uint *)((long)(this->m_sizes).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar4);
    lVar4 = lVar4 + 4;
  } while (*puVar1 <= *puVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Initial value is bigger than units size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Values Executor::loadInitial(const unsigned int numberOfUnits) const
{
    Values initial(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        std::cout << "Insert initial state of " << (i + 1) << ". unit:\n> ";
        std::cin >> initial[i];
        if (initial[i] > m_sizes[i])
            throw std::runtime_error("Initial value is bigger than units size.");
    }

    return initial;
}